

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_main_func.cpp
# Opt level: O3

void __thiscall menu::menuExit(menu *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Program finished the work.","");
  log::addLog((log *)this,Success,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this->m_Exit = true;
  return;
}

Assistant:

void menu::menuExit()
{
    m_Logger(Op::Success, "Program finished the work.");
    m_Exit = true;
}